

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemTxResult
address_space_rw_mips64
          (AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *buf,hwaddr len,_Bool is_write)

{
  MemTxResult MVar1;
  undefined3 in_register_00000089;
  
  if (CONCAT31(in_register_00000089,is_write) != 0) {
    MVar1 = address_space_write_mips64(as,addr,attrs,buf,len);
    return MVar1;
  }
  MVar1 = address_space_read_full_mips64(as,addr,attrs,buf,len);
  return MVar1;
}

Assistant:

MemTxResult address_space_rw(AddressSpace *as, hwaddr addr, MemTxAttrs attrs,
                             void *buf, hwaddr len, bool is_write)
{
    if (is_write) {
        return address_space_write(as, addr, attrs, buf, len);
    } else {
        return address_space_read_full(as, addr, attrs, buf, len);
    }
}